

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feat.c
# Opt level: O3

feat_t * feat_init(char *type,cmn_type_t cmn,int32 varnorm,agc_type_t agc,int32 breport,
                  int32 cepsize)

{
  int iVar1;
  int32 iVar2;
  int iVar3;
  feat_t *ptr;
  size_t sVar4;
  long lVar5;
  code *pcVar6;
  cmn_t *pcVar7;
  agc_t *agc_00;
  mfcc_t **ppmVar8;
  uint32 *puVar9;
  uint32 uVar10;
  char *pcVar11;
  char *pcVar12;
  size_t d1;
  long lVar13;
  ulong uVar14;
  long lVar15;
  int local_58;
  int32 l;
  char *local_48;
  cmn_type_t local_3c;
  int32 local_38;
  agc_type_t local_34;
  
  uVar14 = 0xd;
  if (cepsize != 0) {
    uVar14 = (ulong)(uint)cepsize;
  }
  if (breport != 0) {
    pcVar11 = "yes";
    if (varnorm == 0) {
      pcVar11 = "no";
    }
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
            ,0x2cb,
            "Initializing feature stream to type: \'%s\', ceplen=%d, CMN=\'%s\', VARNORM=\'%s\', AGC=\'%s\'\n"
            ,type,uVar14,cmn_type_str[cmn],pcVar11,agc_type_str[agc]);
  }
  ptr = (feat_t *)
        __ckd_calloc__(1,0x90,
                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                       ,0x2cd);
  ptr->refcount = 1;
  pcVar11 = __ckd_salloc__(type,
                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                           ,0x2cf);
  ptr->name = pcVar11;
  iVar1 = strcmp(type,"s2_4x");
  local_58 = (int)uVar14;
  if (iVar1 == 0) {
    if (local_58 != 0xd) {
      lVar15 = 0x2d3;
LAB_0011871e:
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
              ,lVar15,"s2_4x features require cepsize == 13\n");
      ckd_free(ptr);
      return (feat_t *)0x0;
    }
    ptr->cepsize = 0xd;
    ptr->n_stream = 4;
    puVar9 = (uint32 *)
             __ckd_calloc__(4,4,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                            ,0x2d9);
    ptr->stream_len = puVar9;
    puVar9[0] = 0xc;
    puVar9[1] = 0x18;
    puVar9[2] = 3;
    puVar9[3] = 0xc;
    ptr->out_dim = 0x33;
    ptr->window_size = 4;
    pcVar6 = feat_s2_4x_cep2feat;
  }
  else {
    iVar1 = strcmp(type,"s3_1x39");
    if ((iVar1 == 0) || (iVar1 = strcmp(type,"1s_12c_12d_3p_12dd"), iVar1 == 0)) {
      if (local_58 != 0xd) {
        lVar15 = 0x2e5;
        goto LAB_0011871e;
      }
      ptr->cepsize = 0xd;
      ptr->n_stream = 1;
      puVar9 = (uint32 *)
               __ckd_calloc__(1,4,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                              ,0x2eb);
      ptr->stream_len = puVar9;
      *puVar9 = 0x27;
      ptr->out_dim = 0x27;
      ptr->window_size = 3;
      pcVar6 = feat_s3_1x39_cep2feat;
    }
    else {
      iVar1 = strncmp(type,"1s_c_d_dd",9);
      if (iVar1 == 0) {
        ptr->cepsize = local_58;
        ptr->n_stream = 1;
        puVar9 = (uint32 *)
                 __ckd_calloc__(1,4,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                                ,0x2f4);
        ptr->stream_len = puVar9;
        *puVar9 = local_58 * 3;
        ptr->out_dim = local_58 * 3;
        ptr->window_size = 3;
        pcVar6 = feat_1s_c_d_dd_cep2feat;
      }
      else {
        iVar1 = strncmp(type,"1s_c_d_ld_dd",0xc);
        if (iVar1 == 0) {
          ptr->cepsize = local_58;
          ptr->n_stream = 1;
          puVar9 = (uint32 *)
                   __ckd_calloc__(1,4,
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                                  ,0x2fd);
          ptr->stream_len = puVar9;
          *puVar9 = local_58 << 2;
          ptr->out_dim = local_58 << 2;
          ptr->window_size = 4;
          pcVar6 = feat_1s_c_d_ld_dd_cep2feat;
        }
        else {
          iVar1 = strncmp(type,"cep_dcep",8);
          if ((iVar1 == 0) || (iVar1 = strncmp(type,"1s_c_d",6), iVar1 == 0)) {
            ptr->cepsize = local_58;
            ptr->n_stream = 1;
            puVar9 = (uint32 *)
                     __ckd_calloc__(1,4,
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                                    ,0x307);
            ptr->stream_len = puVar9;
            uVar10 = ptr->cepsize * 2;
            *puVar9 = uVar10;
            ptr->out_dim = uVar10;
            ptr->window_size = 2;
            pcVar6 = feat_s3_cep_dcep;
          }
          else if ((((*type == 'c') && (type[1] == 'e')) && (type[2] == 'p')) ||
                  (iVar1 = strncmp(type,"1s_c",4), iVar1 == 0)) {
            ptr->cepsize = local_58;
            ptr->n_stream = 1;
            puVar9 = (uint32 *)
                     __ckd_calloc__(1,4,
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                                    ,0x311);
            ptr->stream_len = puVar9;
            uVar10 = ptr->cepsize;
            *puVar9 = uVar10;
            ptr->out_dim = uVar10;
            ptr->window_size = 0;
            pcVar6 = feat_s3_cep;
          }
          else {
            iVar1 = strncmp(type,"1s_3c",5);
            if (iVar1 == 0) {
              iVar2 = 3;
            }
            else {
              iVar1 = strncmp(type,"1s_4c",5);
              if (iVar1 != 0) {
                local_38 = varnorm;
                local_34 = agc;
                pcVar11 = __ckd_salloc__(type,
                                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                                         ,0x329);
                local_48 = __ckd_salloc__(type,
                                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                                          ,0x32a);
                sVar4 = strlen(pcVar11);
                lVar15 = 0;
                iVar1 = 0;
                if (1 < sVar4 - 1) {
                  pcVar12 = pcVar11 + 2;
                  lVar5 = sVar4 - 2;
                  iVar1 = 0;
                  do {
                    if (pcVar12[-1] == ',') {
                      pcVar12[-1] = ' ';
                      iVar1 = iVar1 + 1;
                    }
                    else if (pcVar12[-1] == ':') {
                      pcVar12[-1] = '\0';
                      iVar3 = atoi(pcVar12);
                      ptr->window_size = iVar3;
                      break;
                    }
                    pcVar12 = pcVar12 + 1;
                    lVar5 = lVar5 + -1;
                  } while (lVar5 != 0);
                }
                ptr->n_stream = iVar1 + 1;
                puVar9 = (uint32 *)
                         __ckd_calloc__((long)(iVar1 + 1),4,
                                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                                        ,0x341);
                ptr->stream_len = puVar9;
                ptr->out_dim = 0;
                ptr->cepsize = 0;
                iVar1 = __isoc99_sscanf(pcVar11,"%s%n",local_48,&l);
                if (iVar1 == 1) {
                  lVar5 = 0;
                  lVar15 = 0;
                  pcVar12 = pcVar11;
                  local_3c = cmn;
                  do {
                    if (ptr->n_stream <= lVar15) {
LAB_00118abd:
                      lVar15 = 0x34d;
                      goto LAB_00118ad0;
                    }
                    lVar13 = (long)l;
                    iVar1 = __isoc99_sscanf(local_48,"%u",(long)ptr->stream_len + lVar5);
                    if (iVar1 != 1) goto LAB_00118abd;
                    puVar9 = ptr->stream_len;
                    if (puVar9[lVar15] == 0) goto LAB_00118abd;
                    ptr->cepsize = ptr->cepsize + puVar9[lVar15];
                    uVar10 = puVar9[lVar15];
                    if (0 < ptr->window_size) {
                      uVar10 = uVar10 * (ptr->window_size * 2 + 1);
                      puVar9[lVar15] = uVar10;
                    }
                    pcVar12 = pcVar12 + lVar13;
                    ptr->out_dim = ptr->out_dim + uVar10;
                    lVar15 = lVar15 + 1;
                    iVar1 = __isoc99_sscanf(pcVar12,"%s%n",local_48,&l);
                    lVar5 = lVar5 + 4;
                    cmn = local_3c;
                  } while (iVar1 == 1);
                }
                agc = local_34;
                varnorm = local_38;
                if ((int)lVar15 != ptr->n_stream) {
                  lVar15 = 0x357;
LAB_00118ad0:
                  err_msg(ERR_FATAL,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                          ,lVar15,"Bad feature type argument\n");
                  exit(1);
                }
                if (ptr->cepsize != local_58) {
                  lVar15 = 0x359;
                  goto LAB_00118ad0;
                }
                ptr->compute_feat = feat_copy;
                ckd_free(pcVar11);
                ckd_free(local_48);
                goto LAB_001188c7;
              }
              iVar2 = 4;
            }
            ptr->window_size = iVar2;
            ptr->cepsize = local_58;
            ptr->n_stream = 1;
            puVar9 = (uint32 *)
                     __ckd_calloc__(1,4,
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                                    ,800);
            ptr->stream_len = puVar9;
            uVar10 = (ptr->window_size * 2 + 1) * ptr->cepsize;
            *puVar9 = uVar10;
            ptr->out_dim = uVar10;
            pcVar6 = feat_copy;
          }
        }
      }
    }
  }
  ptr->compute_feat = pcVar6;
LAB_001188c7:
  if (cmn != CMN_NONE) {
    pcVar7 = cmn_init(ptr->cepsize);
    ptr->cmn_struct = pcVar7;
  }
  ptr->cmn = cmn;
  ptr->varnorm = varnorm;
  if (agc != AGC_NONE) {
    agc_00 = agc_init();
    ptr->agc_struct = agc_00;
    agc_emax_set(agc_00,*(float32 *)(&DAT_0012b4b0 + (ulong)(cmn == CMN_NONE) * 4));
  }
  ptr->agc = agc;
  d1 = 0x100;
  if (0x80 < ptr->window_size) {
    d1 = (size_t)(uint)(ptr->window_size * 2);
  }
  ppmVar8 = (mfcc_t **)
            __ckd_calloc_2d__(d1,(long)ptr->cepsize,4,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                              ,0x375);
  ptr->cepbuf = ppmVar8;
  ppmVar8 = (mfcc_t **)
            __ckd_calloc__((long)ptr->window_size * 2 + 1,8,
                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                           ,0x379);
  ptr->tmpcepbuf = ppmVar8;
  return ptr;
}

Assistant:

feat_t *
feat_init(char const *type, cmn_type_t cmn, int32 varnorm,
          agc_type_t agc, int32 breport, int32 cepsize)
{
    feat_t *fcb;

    if (cepsize == 0)
        cepsize = 13;
    if (breport)
        E_INFO
            ("Initializing feature stream to type: '%s', ceplen=%d, CMN='%s', VARNORM='%s', AGC='%s'\n",
             type, cepsize, cmn_type_str[cmn], varnorm ? "yes" : "no", agc_type_str[agc]);

    fcb = (feat_t *) ckd_calloc(1, sizeof(feat_t));
    fcb->refcount = 1;
    fcb->name = (char *) ckd_salloc(type);
    if (strcmp(type, "s2_4x") == 0) {
        /* Sphinx-II format 4-stream feature (Hack!! hardwired constants below) */
        if (cepsize != 13) {
            E_ERROR("s2_4x features require cepsize == 13\n");
            ckd_free(fcb);
            return NULL;
        }
        fcb->cepsize = 13;
        fcb->n_stream = 4;
        fcb->stream_len = (uint32 *) ckd_calloc(4, sizeof(uint32));
        fcb->stream_len[0] = 12;
        fcb->stream_len[1] = 24;
        fcb->stream_len[2] = 3;
        fcb->stream_len[3] = 12;
        fcb->out_dim = 51;
        fcb->window_size = 4;
        fcb->compute_feat = feat_s2_4x_cep2feat;
    }
    else if ((strcmp(type, "s3_1x39") == 0) || (strcmp(type, "1s_12c_12d_3p_12dd") == 0)) {
        /* 1-stream cep/dcep/pow/ddcep (Hack!! hardwired constants below) */
        if (cepsize != 13) {
            E_ERROR("s2_4x features require cepsize == 13\n");
            ckd_free(fcb);
            return NULL;
        }
        fcb->cepsize = 13;
        fcb->n_stream = 1;
        fcb->stream_len = (uint32 *) ckd_calloc(1, sizeof(uint32));
        fcb->stream_len[0] = 39;
        fcb->out_dim = 39;
        fcb->window_size = 3;
        fcb->compute_feat = feat_s3_1x39_cep2feat;
    }
    else if (strncmp(type, "1s_c_d_dd", 9) == 0) {
        fcb->cepsize = cepsize;
        fcb->n_stream = 1;
        fcb->stream_len = (uint32 *) ckd_calloc(1, sizeof(uint32));
        fcb->stream_len[0] = cepsize * 3;
        fcb->out_dim = cepsize * 3;
        fcb->window_size = FEAT_DCEP_WIN + 1; /* ddcep needs the extra 1 */
        fcb->compute_feat = feat_1s_c_d_dd_cep2feat;
    }
    else if (strncmp(type, "1s_c_d_ld_dd", 12) == 0) {
        fcb->cepsize = cepsize;
        fcb->n_stream = 1;
        fcb->stream_len = (uint32 *) ckd_calloc(1, sizeof(uint32));
        fcb->stream_len[0] = cepsize * 4;
        fcb->out_dim = cepsize * 4;
        fcb->window_size = FEAT_DCEP_WIN * 2;
        fcb->compute_feat = feat_1s_c_d_ld_dd_cep2feat;
    }
    else if (strncmp(type, "cep_dcep", 8) == 0 || strncmp(type, "1s_c_d", 6) == 0) {
        /* 1-stream cep/dcep */
        fcb->cepsize = cepsize;
        fcb->n_stream = 1;
        fcb->stream_len = (uint32 *) ckd_calloc(1, sizeof(uint32));
        fcb->stream_len[0] = feat_cepsize(fcb) * 2;
        fcb->out_dim = fcb->stream_len[0];
        fcb->window_size = 2;
        fcb->compute_feat = feat_s3_cep_dcep;
    }
    else if (strncmp(type, "cep", 3) == 0 || strncmp(type, "1s_c", 4) == 0) {
        /* 1-stream cep */
        fcb->cepsize = cepsize;
        fcb->n_stream = 1;
        fcb->stream_len = (uint32 *) ckd_calloc(1, sizeof(uint32));
        fcb->stream_len[0] = feat_cepsize(fcb);
        fcb->out_dim = fcb->stream_len[0];
        fcb->window_size = 0;
        fcb->compute_feat = feat_s3_cep;
    }
    else if (strncmp(type, "1s_3c", 5) == 0 || strncmp(type, "1s_4c", 5) == 0) {
	/* 1-stream cep with frames concatenated, so called cepwin features */
        if (strncmp(type, "1s_3c", 5) == 0)
            fcb->window_size = 3;
        else
    	    fcb->window_size = 4;

        fcb->cepsize = cepsize;
        fcb->n_stream = 1;
        fcb->stream_len = (uint32 *) ckd_calloc(1, sizeof(uint32));
        fcb->stream_len[0] = feat_cepsize(fcb) * (2 * fcb->window_size + 1);
        fcb->out_dim = fcb->stream_len[0];
        fcb->compute_feat = feat_copy;
    }
    else {
        int32 i, k, l;
        size_t len;
        char *strp;
        char *mtype = ckd_salloc(type);
        char *wd = ckd_salloc(type);
        /*
         * Generic definition: Format should be %d,%d,%d,...,%d (i.e.,
         * comma separated list of feature stream widths; #items =
         * #streams).  An optional window size (frames will be
         * concatenated) is also allowed, which can be specified with
         * a colon after the list of feature streams.
         */
        len = strlen(mtype);
        k = 0;
        for (i = 1; i < len - 1; i++) {
            if (mtype[i] == ',') {
                mtype[i] = ' ';
                k++;
            }
            else if (mtype[i] == ':') {
                mtype[i] = '\0';
                fcb->window_size = atoi(mtype + i + 1);
                break;
            }
        }
        k++;                    /* Presumably there are (#commas+1) streams */
        fcb->n_stream = k;
        fcb->stream_len = (uint32 *) ckd_calloc(k, sizeof(uint32));

        /* Scan individual feature stream lengths */
        strp = mtype;
        i = 0;
        fcb->out_dim = 0;
        fcb->cepsize = 0;
        while (sscanf(strp, "%s%n", wd, &l) == 1) {
            strp += l;
            if ((i >= fcb->n_stream)
                || (sscanf(wd, "%u", &(fcb->stream_len[i])) != 1)
                || (fcb->stream_len[i] <= 0))
                E_FATAL("Bad feature type argument\n");
            /* Input size before windowing */
            fcb->cepsize += fcb->stream_len[i];
            if (fcb->window_size > 0)
                fcb->stream_len[i] *= (fcb->window_size * 2 + 1);
            /* Output size after windowing */
            fcb->out_dim += fcb->stream_len[i];
            i++;
        }
        if (i != fcb->n_stream)
            E_FATAL("Bad feature type argument\n");
        if (fcb->cepsize != cepsize)
    	    E_FATAL("Bad feature type argument\n");

        /* Input is already the feature stream */
        fcb->compute_feat = feat_copy;
        ckd_free(mtype);
        ckd_free(wd);
    }

    if (cmn != CMN_NONE)
        fcb->cmn_struct = cmn_init(feat_cepsize(fcb));
    fcb->cmn = cmn;
    fcb->varnorm = varnorm;
    if (agc != AGC_NONE) {
        fcb->agc_struct = agc_init();
        /*
         * No need to check if agc is set to EMAX; agc_emax_set() changes only emax related things
         * Moreover, if agc is not NONE and block mode is used, feat_agc() SILENTLY
         * switches to EMAX
         */
        /* HACK: hardwired initial estimates based on use of CMN (from Sphinx2) */
        agc_emax_set(fcb->agc_struct, (cmn != CMN_NONE) ? 5.0 : 10.0);
    }
    fcb->agc = agc;
    /*
     * Make sure this buffer is large enough to be used in feat_s2mfc2feat_block_utt()
     */
    fcb->cepbuf = (mfcc_t **) ckd_calloc_2d((LIVEBUFBLOCKSIZE < feat_window_size(fcb) * 2) ? feat_window_size(fcb) * 2 : LIVEBUFBLOCKSIZE,
                                            feat_cepsize(fcb),
                                            sizeof(mfcc_t));
    /* This one is actually just an array of pointers to "flatten out"
     * wraparounds. */
    fcb->tmpcepbuf = (mfcc_t** )ckd_calloc(2 * feat_window_size(fcb) + 1,
                                sizeof(*fcb->tmpcepbuf));

    return fcb;
}